

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printSBitModifierOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar1 = MCOperand_getReg(op);
  if ((uVar1 != 0) && (SStream_concat0(O,"s"), MI->csh->detail != CS_OPT_OFF)) {
    (MI->flat_insn->detail->field_6).arm.update_flags = true;
  }
  return;
}

Assistant:

static void printSBitModifierOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	if (MCOperand_getReg(MCInst_getOperand(MI, OpNum))) {
		//assert(MCOperand_getReg(MCInst_getOperand(MI, OpNum)) == ARM_CPSR &&
		//       "Expect ARM CPSR register!");
		SStream_concat0(O, "s");
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.update_flags = true;
	}
}